

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::Detail::rangeToString<char8_t_const*,char8_t_const*>
          (string *__return_storage_ptr__,Detail *this,char8_t *first,char8_t *last)

{
  ReusableStringStream *this_00;
  string local_88;
  string local_68;
  undefined1 local_38 [8];
  ReusableStringStream rss;
  char8_t *last_local;
  char8_t *first_local;
  
  rss.m_oss = (ostream *)first;
  ReusableStringStream::ReusableStringStream((ReusableStringStream *)local_38);
  ReusableStringStream::operator<<((ReusableStringStream *)local_38,(char (*) [3])"{ ");
  if (this != (Detail *)rss.m_oss) {
    stringify<char8_t>(&local_68,(char8_t *)this);
    ReusableStringStream::operator<<
              ((ReusableStringStream *)local_38,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    for (last_local = (char8_t *)(this + 1); (ostream *)last_local != rss.m_oss;
        last_local = last_local + 1) {
      this_00 = ReusableStringStream::operator<<
                          ((ReusableStringStream *)local_38,(char (*) [3])", ");
      stringify<char8_t>(&local_88,last_local);
      ReusableStringStream::operator<<
                (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_88);
      std::__cxx11::string::~string((string *)&local_88);
    }
  }
  ReusableStringStream::operator<<((ReusableStringStream *)local_38,(char (*) [3])" }");
  ReusableStringStream::str_abi_cxx11_
            ((string *)__return_storage_ptr__,(ReusableStringStream *)local_38);
  ReusableStringStream::~ReusableStringStream((ReusableStringStream *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string rangeToString(InputIterator first, Sentinel last) {
            ReusableStringStream rss;
            rss << "{ ";
            if (first != last) {
                rss << ::Catch::Detail::stringify(*first);
                for (++first; first != last; ++first)
                    rss << ", " << ::Catch::Detail::stringify(*first);
            }
            rss << " }";
            return rss.str();
        }